

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

var cs_impl::runtime_cs_ext::create_co(var *func)

{
  initializer_list<cs_impl::any> __l;
  bool bVar1;
  callable *pcVar2;
  undefined8 uVar3;
  proxy *in_RDI;
  function *fptr_1;
  function_type *impl_f_1;
  object_method *om;
  function *fptr;
  function_type *impl_f;
  function *in_stack_fffffffffffffdb8;
  fiber_callable *in_stack_fffffffffffffdc0;
  function *in_stack_fffffffffffffdc8;
  fiber_callable *in_stack_fffffffffffffdd0;
  function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
  *in_stack_fffffffffffffdd8;
  allocator_type *in_stack_fffffffffffffde8;
  undefined8 **ppuVar4;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_fffffffffffffdf0;
  undefined8 **ppuVar5;
  undefined8 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  function<void_()> *in_stack_fffffffffffffe20;
  context_t *in_stack_fffffffffffffe28;
  allocator *paVar6;
  any *in_stack_fffffffffffffe40;
  undefined1 *local_188;
  undefined8 *local_180;
  undefined8 local_178;
  routine_t local_10c;
  function *local_f8;
  undefined1 local_ea;
  allocator local_e9;
  string local_e8 [32];
  function_type *local_c8;
  object_method *local_c0;
  routine_t local_6c;
  function *local_58;
  undefined1 local_4d;
  allocator local_39;
  string local_38 [32];
  function_type *local_18;
  
  any::type((any *)in_stack_fffffffffffffdc0);
  bVar1 = std::type_info::operator==
                    ((type_info *)in_stack_fffffffffffffdd0,(type_info *)in_stack_fffffffffffffdc8);
  if (bVar1) {
    pcVar2 = any::const_val<cs::callable>(in_stack_fffffffffffffe40);
    local_18 = cs::callable::get_raw_data(pcVar2);
    std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
    target_type(in_stack_fffffffffffffdd8);
    bVar1 = std::type_info::operator!=
                      ((type_info *)in_stack_fffffffffffffdc0,(type_info *)in_stack_fffffffffffffdb8
                      );
    if (bVar1) {
      local_4d = 1;
      uVar3 = __cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_38,"Only can create coroutine from covscript function.",&local_39);
      cs::lang_error::lang_error
                ((lang_error *)in_stack_fffffffffffffdc0,(string *)in_stack_fffffffffffffdb8);
      local_4d = 0;
      __cxa_throw(uVar3,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
    }
    local_58 = std::
               function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
               target<cs::function>(in_stack_fffffffffffffdd8);
    cs::function::get_context(local_58);
    fiber_callable::fiber_callable(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    std::function<void()>::function<cs_impl::runtime_cs_ext::fiber_callable,void>
              ((function<void_()> *)in_stack_fffffffffffffdd0,
               (fiber_callable *)in_stack_fffffffffffffdc8);
    local_6c = fiber::create(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    std::make_shared<cs_impl::runtime_cs_ext::fiber_holder_impl,unsigned_int>
              ((uint *)in_stack_fffffffffffffde8);
    any::any<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>>
              ((any *)in_stack_fffffffffffffdd0,
               (shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl> *)in_stack_fffffffffffffdc8);
    std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>::~shared_ptr
              ((shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl> *)0x44a29c);
    std::function<void_()>::~function((function<void_()> *)0x44a2a9);
    fiber_callable::~fiber_callable((fiber_callable *)0x44a2b6);
  }
  else {
    any::type((any *)in_stack_fffffffffffffdc0);
    bVar1 = std::type_info::operator==
                      ((type_info *)in_stack_fffffffffffffdd0,(type_info *)in_stack_fffffffffffffdc8
                      );
    if (bVar1) {
      local_c0 = any::const_val<cs::object_method>(in_stack_fffffffffffffe40);
      pcVar2 = any::const_val<cs::callable>(in_stack_fffffffffffffe40);
      local_c8 = cs::callable::get_raw_data(pcVar2);
      std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
      target_type(in_stack_fffffffffffffdd8);
      bVar1 = std::type_info::operator!=
                        ((type_info *)in_stack_fffffffffffffdc0,
                         (type_info *)in_stack_fffffffffffffdb8);
      if (bVar1) {
        local_ea = 1;
        uVar3 = __cxa_allocate_exception(0x20);
        paVar6 = &local_e9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_e8,"Only can create coroutine from covscript function.",paVar6);
        cs::lang_error::lang_error
                  ((lang_error *)in_stack_fffffffffffffdc0,(string *)in_stack_fffffffffffffdb8);
        local_ea = 0;
        __cxa_throw(uVar3,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
      }
      local_f8 = std::
                 function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                 ::target<cs::function>(in_stack_fffffffffffffdd8);
      cs::function::get_context(local_f8);
      any::any((any *)in_stack_fffffffffffffdc0,(any *)in_stack_fffffffffffffdb8);
      local_180 = &local_188;
      local_178 = 1;
      std::allocator<cs_impl::any>::allocator((allocator<cs_impl::any> *)0x44a502);
      __l._M_len._0_4_ = in_stack_fffffffffffffe00;
      __l._M_array = (iterator)in_stack_fffffffffffffdf8;
      __l._M_len._4_4_ = in_stack_fffffffffffffe04;
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
                (in_stack_fffffffffffffdf0,__l,in_stack_fffffffffffffde8);
      fiber_callable::fiber_callable
                (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                 (vector *)in_stack_fffffffffffffdc0);
      std::function<void()>::function<cs_impl::runtime_cs_ext::fiber_callable,void>
                ((function<void_()> *)in_stack_fffffffffffffdd0,
                 (fiber_callable *)in_stack_fffffffffffffdc8);
      local_10c = fiber::create(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      std::make_shared<cs_impl::runtime_cs_ext::fiber_holder_impl,unsigned_int>
                ((uint *)in_stack_fffffffffffffde8);
      any::any<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>>
                ((any *)in_stack_fffffffffffffdd0,
                 (shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl> *)in_stack_fffffffffffffdc8
                );
      std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>::~shared_ptr
                ((shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl> *)0x44a5b7);
      std::function<void_()>::~function((function<void_()> *)0x44a5c4);
      fiber_callable::~fiber_callable((fiber_callable *)0x44a5d1);
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
                ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffdd0);
      std::allocator<cs_impl::any>::~allocator((allocator<cs_impl::any> *)0x44a5eb);
      ppuVar5 = (undefined8 **)&local_188;
      ppuVar4 = &local_180;
      do {
        ppuVar4 = ppuVar4 + -1;
        any::~any((any *)0x44a614);
      } while (ppuVar4 != ppuVar5);
    }
    else {
      any::any<cs::pointer>((any *)in_stack_fffffffffffffdd0,(pointer *)in_stack_fffffffffffffdc8);
    }
  }
  return (var)in_RDI;
}

Assistant:

var create_co(const var &func)
		{
			if (func.type() == typeid(callable)) {
				const cs::callable::function_type &impl_f = func.const_val<callable>().get_raw_data();
				if (impl_f.target_type() != typeid(function))
					throw lang_error("Only can create coroutine from covscript function.");
				function const *fptr = impl_f.target<function>();
				return std::make_shared<fiber_holder_impl>(fiber::create(fptr->get_context(),fiber_callable(fptr)));
			}
			else if (func.type() == typeid(object_method)) {
				const auto &om = func.const_val<object_method>();
				const cs::callable::function_type &impl_f = om.callable.const_val<callable>().get_raw_data();
				if (impl_f.target_type() != typeid(function))
					throw lang_error("Only can create coroutine from covscript function.");
				function const *fptr = impl_f.target<function>();
				return std::make_shared<fiber_holder_impl>(fiber::create(fptr->get_context(), fiber_callable(fptr, {om.object})));
			}
			return null_pointer;
		}